

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O0

void __thiscall
LASwriteItemCompressed_POINT14_v4::write_gps_time
          (LASwriteItemCompressed_POINT14_v4 *this,U64I64F64 gps_time)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  I32 real;
  float fVar4;
  U32 local_7c;
  I32 other_gpstime_diff_1;
  I64 other_gpstime_diff_64_1;
  U32 i_1;
  I32 multi;
  F32 multi_f;
  I32 curr_gpstime_diff_1;
  I64 curr_gpstime_diff_64_1;
  I32 other_gpstime_diff;
  I64 other_gpstime_diff_64;
  U32 i;
  I32 curr_gpstime_diff;
  I64 curr_gpstime_diff_64;
  LASwriteItemCompressed_POINT14_v4 *this_local;
  U64I64F64 gps_time_local;
  
  real = (I32)((ulong)gps_time >> 0x20);
  if (this->contexts[this->current_context].last_gpstime_diff
      [this->contexts[this->current_context].last] == 0) {
    lVar3 = gps_time.u64 -
            this->contexts[this->current_context].last_gpstime
            [this->contexts[this->current_context].last].u64;
    iVar2 = (int)lVar3;
    if (lVar3 == iVar2) {
      ArithmeticEncoder::encodeSymbol
                (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_0diff,0);
      IntegerCompressor::compress(this->contexts[this->current_context].ic_gpstime,0,iVar2,0);
      this->contexts[this->current_context].last_gpstime_diff
      [this->contexts[this->current_context].last] = iVar2;
      this->contexts[this->current_context].multi_extreme_counter
      [this->contexts[this->current_context].last] = 0;
    }
    else {
      for (other_gpstime_diff_64._0_4_ = 1; (uint)other_gpstime_diff_64 < 4;
          other_gpstime_diff_64._0_4_ = (uint)other_gpstime_diff_64 + 1) {
        lVar3 = gps_time.u64 -
                this->contexts[this->current_context].last_gpstime
                [this->contexts[this->current_context].last + (uint)other_gpstime_diff_64 & 3].u64;
        if (lVar3 == (int)lVar3) {
          ArithmeticEncoder::encodeSymbol
                    (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_0diff,
                     (uint)other_gpstime_diff_64 + 1);
          this->contexts[this->current_context].last =
               this->contexts[this->current_context].last + (uint)other_gpstime_diff_64 & 3;
          write_gps_time(this,gps_time);
          return;
        }
      }
      ArithmeticEncoder::encodeSymbol
                (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_0diff,1);
      IntegerCompressor::compress
                (this->contexts[this->current_context].ic_gpstime,
                 (I32)((ulong)this->contexts[this->current_context].last_gpstime
                              [this->contexts[this->current_context].last].i64 >> 0x20),real,8);
      ArithmeticEncoder::writeInt(this->enc_gps_time,(U32)gps_time.u64);
      this->contexts[this->current_context].next =
           this->contexts[this->current_context].next + 1 & 3;
      this->contexts[this->current_context].last = this->contexts[this->current_context].next;
      this->contexts[this->current_context].last_gpstime_diff
      [this->contexts[this->current_context].last] = 0;
      this->contexts[this->current_context].multi_extreme_counter
      [this->contexts[this->current_context].last] = 0;
    }
    this->contexts[this->current_context].last_gpstime[this->contexts[this->current_context].last] =
         gps_time;
  }
  else {
    lVar3 = gps_time.u64 -
            this->contexts[this->current_context].last_gpstime
            [this->contexts[this->current_context].last].u64;
    iVar2 = (int)lVar3;
    if (lVar3 == iVar2) {
      fVar4 = (float)iVar2 /
              (float)this->contexts[this->current_context].last_gpstime_diff
                     [this->contexts[this->current_context].last];
      if (fVar4 < 0.0) {
        fVar4 = fVar4 - 0.5;
      }
      else {
        fVar4 = fVar4 + 0.5;
      }
      local_7c = (U32)fVar4;
      if (local_7c == 1) {
        ArithmeticEncoder::encodeSymbol
                  (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_multi,1);
        IntegerCompressor::compress
                  (this->contexts[this->current_context].ic_gpstime,
                   this->contexts[this->current_context].last_gpstime_diff
                   [this->contexts[this->current_context].last],iVar2,1);
        this->contexts[this->current_context].multi_extreme_counter
        [this->contexts[this->current_context].last] = 0;
      }
      else if ((int)local_7c < 1) {
        if ((int)local_7c < 0) {
          if ((int)local_7c < -9) {
            ArithmeticEncoder::encodeSymbol
                      (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_multi,
                       0x1fe);
            IntegerCompressor::compress
                      (this->contexts[this->current_context].ic_gpstime,
                       this->contexts[this->current_context].last_gpstime_diff
                       [this->contexts[this->current_context].last] * -10,iVar2,6);
            uVar1 = this->contexts[this->current_context].last;
            this->contexts[this->current_context].multi_extreme_counter[uVar1] =
                 this->contexts[this->current_context].multi_extreme_counter[uVar1] + 1;
            if (3 < this->contexts[this->current_context].multi_extreme_counter
                    [this->contexts[this->current_context].last]) {
              this->contexts[this->current_context].last_gpstime_diff
              [this->contexts[this->current_context].last] = iVar2;
              this->contexts[this->current_context].multi_extreme_counter
              [this->contexts[this->current_context].last] = 0;
            }
          }
          else {
            ArithmeticEncoder::encodeSymbol
                      (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_multi,
                       500 - local_7c);
            IntegerCompressor::compress
                      (this->contexts[this->current_context].ic_gpstime,
                       local_7c *
                       this->contexts[this->current_context].last_gpstime_diff
                       [this->contexts[this->current_context].last],iVar2,5);
          }
        }
        else {
          ArithmeticEncoder::encodeSymbol
                    (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_multi,0);
          IntegerCompressor::compress(this->contexts[this->current_context].ic_gpstime,0,iVar2,7);
          uVar1 = this->contexts[this->current_context].last;
          this->contexts[this->current_context].multi_extreme_counter[uVar1] =
               this->contexts[this->current_context].multi_extreme_counter[uVar1] + 1;
          if (3 < this->contexts[this->current_context].multi_extreme_counter
                  [this->contexts[this->current_context].last]) {
            this->contexts[this->current_context].last_gpstime_diff
            [this->contexts[this->current_context].last] = iVar2;
            this->contexts[this->current_context].multi_extreme_counter
            [this->contexts[this->current_context].last] = 0;
          }
        }
      }
      else if ((int)local_7c < 500) {
        ArithmeticEncoder::encodeSymbol
                  (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_multi,local_7c
                  );
        if ((int)local_7c < 10) {
          IntegerCompressor::compress
                    (this->contexts[this->current_context].ic_gpstime,
                     local_7c *
                     this->contexts[this->current_context].last_gpstime_diff
                     [this->contexts[this->current_context].last],iVar2,2);
        }
        else {
          IntegerCompressor::compress
                    (this->contexts[this->current_context].ic_gpstime,
                     local_7c *
                     this->contexts[this->current_context].last_gpstime_diff
                     [this->contexts[this->current_context].last],iVar2,3);
        }
      }
      else {
        ArithmeticEncoder::encodeSymbol
                  (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_multi,500);
        IntegerCompressor::compress
                  (this->contexts[this->current_context].ic_gpstime,
                   this->contexts[this->current_context].last_gpstime_diff
                   [this->contexts[this->current_context].last] * 500,iVar2,4);
        uVar1 = this->contexts[this->current_context].last;
        this->contexts[this->current_context].multi_extreme_counter[uVar1] =
             this->contexts[this->current_context].multi_extreme_counter[uVar1] + 1;
        if (3 < this->contexts[this->current_context].multi_extreme_counter
                [this->contexts[this->current_context].last]) {
          this->contexts[this->current_context].last_gpstime_diff
          [this->contexts[this->current_context].last] = iVar2;
          this->contexts[this->current_context].multi_extreme_counter
          [this->contexts[this->current_context].last] = 0;
        }
      }
    }
    else {
      for (other_gpstime_diff_64_1._0_4_ = 1; (uint)other_gpstime_diff_64_1 < 4;
          other_gpstime_diff_64_1._0_4_ = (uint)other_gpstime_diff_64_1 + 1) {
        lVar3 = gps_time.u64 -
                this->contexts[this->current_context].last_gpstime
                [this->contexts[this->current_context].last + (uint)other_gpstime_diff_64_1 & 3].u64
        ;
        if (lVar3 == (int)lVar3) {
          ArithmeticEncoder::encodeSymbol
                    (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_multi,
                     (uint)other_gpstime_diff_64_1 + 0x1ff);
          this->contexts[this->current_context].last =
               this->contexts[this->current_context].last + (uint)other_gpstime_diff_64_1 & 3;
          write_gps_time(this,gps_time);
          return;
        }
      }
      ArithmeticEncoder::encodeSymbol
                (this->enc_gps_time,this->contexts[this->current_context].m_gpstime_multi,0x1ff);
      IntegerCompressor::compress
                (this->contexts[this->current_context].ic_gpstime,
                 (I32)((ulong)this->contexts[this->current_context].last_gpstime
                              [this->contexts[this->current_context].last].i64 >> 0x20),real,8);
      ArithmeticEncoder::writeInt(this->enc_gps_time,(U32)gps_time.u64);
      this->contexts[this->current_context].next =
           this->contexts[this->current_context].next + 1 & 3;
      this->contexts[this->current_context].last = this->contexts[this->current_context].next;
      this->contexts[this->current_context].last_gpstime_diff
      [this->contexts[this->current_context].last] = 0;
      this->contexts[this->current_context].multi_extreme_counter
      [this->contexts[this->current_context].last] = 0;
    }
    this->contexts[this->current_context].last_gpstime[this->contexts[this->current_context].last] =
         gps_time;
  }
  return;
}

Assistant:

void LASwriteItemCompressed_POINT14_v4::write_gps_time(const U64I64F64 gps_time)
{
  if (contexts[current_context].last_gpstime_diff[contexts[current_context].last] == 0) // if the last integer difference was zero
  {
    // calculate the difference between the two doubles as an integer
    I64 curr_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[contexts[current_context].last].i64;
    I32 curr_gpstime_diff = (I32)curr_gpstime_diff_64;
    if (curr_gpstime_diff_64 == (I64)(curr_gpstime_diff))
    {
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, 0); // the difference can be represented with 32 bits
      contexts[current_context].ic_gpstime->compress(0, curr_gpstime_diff, 0);
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    else // the difference is huge
    {
      U32 i;
      // maybe the double belongs to another time sequence
      for (i = 1; i < 4; i++)
      {
        I64 other_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[(contexts[current_context].last+i)&3].i64;
        I32 other_gpstime_diff = (I32)other_gpstime_diff_64;
        if (other_gpstime_diff_64 == (I64)(other_gpstime_diff))
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, i+1); // it belongs to another sequence 
          contexts[current_context].last = (contexts[current_context].last+i)&3;
          write_gps_time(gps_time);
          return;
        }
      }
      // no other sequence found. start new sequence.
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, 1); 
      contexts[current_context].ic_gpstime->compress((I32)(contexts[current_context].last_gpstime[contexts[current_context].last].u64 >> 32), (I32)(gps_time.u64 >> 32), 8);
      enc_gps_time->writeInt((U32)(gps_time.u64));
      contexts[current_context].next = (contexts[current_context].next+1)&3;
      contexts[current_context].last = contexts[current_context].next;
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = 0;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    contexts[current_context].last_gpstime[contexts[current_context].last].i64 = gps_time.i64;
  }
  else // the last integer difference was *not* zero
  {
    // calculate the difference between the two doubles as an integer
    I64 curr_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[contexts[current_context].last].i64;
    I32 curr_gpstime_diff = (I32)curr_gpstime_diff_64;

    // if the current gpstime difference can be represented with 32 bits
    if (curr_gpstime_diff_64 == (I64)(curr_gpstime_diff))
    {
      // compute multiplier between current and last integer difference
      F32 multi_f = (F32)curr_gpstime_diff / (F32)(contexts[current_context].last_gpstime_diff[contexts[current_context].last]);
      I32 multi = I32_QUANTIZE(multi_f);

      // compress the residual curr_gpstime_diff in dependance on the multiplier
      if (multi == 1)
      {
        // this is the case we assume we get most often for regular spaced pulses
        enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, 1);
        contexts[current_context].ic_gpstime->compress(contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 1);
        contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
      }
      else if (multi > 0)
      {
        if (multi < LASZIP_GPSTIME_MULTI) // positive multipliers up to LASZIP_GPSTIME_MULTI are compressed directly
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, multi);
          if (multi < 10)
            contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 2);
          else
            contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 3);
        }
        else
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI);
          contexts[current_context].ic_gpstime->compress(LASZIP_GPSTIME_MULTI*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 4);
          contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
          if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
          {
            contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
            contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
          }
        }
      }
      else if (multi < 0)
      {
        if (multi > LASZIP_GPSTIME_MULTI_MINUS) // negative multipliers larger than LASZIP_GPSTIME_MULTI_MINUS are compressed directly
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI - multi);
          contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 5);
        }
        else
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI - LASZIP_GPSTIME_MULTI_MINUS);
          contexts[current_context].ic_gpstime->compress(LASZIP_GPSTIME_MULTI_MINUS*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 6);
          contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
          if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
          {
            contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
            contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
          }
        }
      }
      else
      {
        enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, 0);
        contexts[current_context].ic_gpstime->compress(0, curr_gpstime_diff, 7);
        contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
        if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
        {
          contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
          contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
        }
      }
    }
    else // the difference is huge
    {
      U32 i;
      // maybe the double belongs to another time sequence
      for (i = 1; i < 4; i++)
      {
        I64 other_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[(contexts[current_context].last+i)&3].i64;
        I32 other_gpstime_diff = (I32)other_gpstime_diff_64;
        if (other_gpstime_diff_64 == (I64)(other_gpstime_diff))
        {
          // it belongs to this sequence 
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI_CODE_FULL+i);
          contexts[current_context].last = (contexts[current_context].last+i)&3;
          write_gps_time(gps_time);
          return;
        }
      }
      // no other sequence found. start new sequence.
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI_CODE_FULL);
      contexts[current_context].ic_gpstime->compress((I32)(contexts[current_context].last_gpstime[contexts[current_context].last].u64 >> 32), (I32)(gps_time.u64 >> 32), 8);
      enc_gps_time->writeInt((U32)(gps_time.u64));
      contexts[current_context].next = (contexts[current_context].next+1)&3;
      contexts[current_context].last = contexts[current_context].next;
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = 0;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    contexts[current_context].last_gpstime[contexts[current_context].last].i64 = gps_time.i64;
  }
}